

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderAdjacencyTests::GeometryShaderAdjacencyTests
          (GeometryShaderAdjacencyTests *this,Context *context,ExtParameters *extParams,char *name,
          char *description)

{
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,context->m_testCtx,name,description);
  (this->super_TestCaseGroupBase).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02148e90;
  (this->super_TestCaseGroupBase).m_context = context;
  (this->super_TestCaseGroupBase).m_extParams = *extParams;
  (this->super_TestCaseGroupBase).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderAdjacencyTests_0214a9f8;
  this->m_grid_granulity = 1;
  this->m_n_components_input = 2;
  this->m_n_components_output = 4;
  this->m_n_line_segments = 4;
  this->m_n_vertices_per_triangle = 3;
  (this->m_tests_data).
  super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tests_data).
  super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tests_data).
  super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

GeometryShaderAdjacencyTests::GeometryShaderAdjacencyTests(Context& context, const ExtParameters& extParams,
														   const char* name, const char* description)
	: TestCaseGroupBase(context, extParams, name, description)
	, m_grid_granulity(1)
	, m_n_components_input(2)
	, m_n_components_output(4)
	, m_n_line_segments(4)
	, m_n_vertices_per_triangle(3)
{
	/* Nothing to be done here */
}